

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::unfoldedBlockinstr<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  bool bVar1;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseModuleTypesCtx *ctx_local;
  MaybeResult<wasm::Ok> *i;
  
  NullInstrParserCtx::setSrcLoc((NullInstrParserCtx *)ctx,annotations);
  block<wasm::WATParser::ParseModuleTypesCtx>(__return_storage_ptr__,ctx,annotations,false);
  bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)__return_storage_ptr__);
  if (!bVar1) {
    MaybeResult<wasm::Ok>::~MaybeResult(__return_storage_ptr__);
    ifelse<wasm::WATParser::ParseModuleTypesCtx>(__return_storage_ptr__,ctx,annotations,false);
    bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)__return_storage_ptr__);
    if (!bVar1) {
      MaybeResult<wasm::Ok>::~MaybeResult(__return_storage_ptr__);
      loop<wasm::WATParser::ParseModuleTypesCtx>(__return_storage_ptr__,ctx,annotations,false);
      bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)__return_storage_ptr__);
      if (!bVar1) {
        MaybeResult<wasm::Ok>::~MaybeResult(__return_storage_ptr__);
        trycatch<wasm::WATParser::ParseModuleTypesCtx>(__return_storage_ptr__,ctx,annotations,false)
        ;
        bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)__return_storage_ptr__);
        if (!bVar1) {
          MaybeResult<wasm::Ok>::~MaybeResult(__return_storage_ptr__);
          trytable<wasm::WATParser::ParseModuleTypesCtx>
                    (__return_storage_ptr__,ctx,annotations,false);
          bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)__return_storage_ptr__);
          if (!bVar1) {
            MaybeResult<wasm::Ok>::~MaybeResult(__return_storage_ptr__);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> unfoldedBlockinstr(Ctx& ctx,
                                 const std::vector<Annotation>& annotations) {
  ctx.setSrcLoc(annotations);
  if (auto i = block(ctx, annotations, false)) {
    return i;
  }
  if (auto i = ifelse(ctx, annotations, false)) {
    return i;
  }
  if (auto i = loop(ctx, annotations, false)) {
    return i;
  }
  if (auto i = trycatch(ctx, annotations, false)) {
    return i;
  }
  if (auto i = trytable(ctx, annotations, false)) {
    return i;
  }
  return {};
}